

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

ImportCacheValue * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::importData
          (Interpreter *this,LocationRange *loc,LiteralString *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  JsonnetImportCallback *pJVar2;
  void *pvVar3;
  char *pcVar4;
  _Alloc_hider _Var5;
  int iVar6;
  mapped_type *ppIVar7;
  mapped_type pIVar8;
  long *plVar9;
  RuntimeError *__return_storage_ptr__;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar10;
  char *buf;
  string msg;
  string input;
  size_t buflen;
  char *found_here_cptr;
  string dir;
  string epath;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  key;
  char *local_138;
  UString local_130;
  string local_110;
  Interpreter *local_f0;
  size_t local_e8;
  char *local_e0;
  LocationRange *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  local_70;
  
  path_dir_with_trailing_separator(&local_b0,&loc->file);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_70,&local_b0,&file->value);
  local_f0 = this;
  ppIVar7 = std::
            map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
            ::operator[](&this->cachedImports,&local_70);
  _Var5._M_p = local_b0._M_dataplus._M_p;
  pIVar8 = *ppIVar7;
  if (pIVar8 == (mapped_type)0x0) {
    local_138 = (char *)0x0;
    local_e8 = 0;
    pJVar2 = local_f0->importCallback;
    pvVar3 = local_f0->importCallbackContext;
    local_d8 = loc;
    encode_utf8(&local_110,(internal *)(file->value)._M_dataplus._M_p,
                (UString *)(file->value)._M_string_length);
    iVar6 = (*pJVar2)(pvVar3,_Var5._M_p,local_110._M_dataplus._M_p,&local_e0,&local_138,&local_e8);
    paVar1 = &local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,local_138,local_138 + local_e8);
    free(local_138);
    if (iVar6 == 1) {
      jsonnet_string_escape(&local_130,&file->value,false);
      encode_utf8(&local_90,(internal *)local_130._M_dataplus._M_p,
                  (UString *)local_130._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity * 4 + 4);
      }
      std::operator+(&local_d0,"couldn\'t open import \"",&local_90);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_130._M_dataplus._M_p = (pointer)*plVar9;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_130._M_dataplus._M_p == paVar10) {
        local_130.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_130.field_2._8_8_ = plVar9[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_130._M_string_length = plVar9[1];
      *plVar9 = (long)paVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110._M_dataplus._M_p);
      __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
      Stack::makeError(__return_storage_ptr__,&local_f0->stack,local_d8,(string *)&local_130);
      __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    pIVar8 = (mapped_type)operator_new(0x48);
    pcVar4 = local_e0;
    (pIVar8->content)._M_dataplus._M_p = (pointer)0x0;
    (pIVar8->content)._M_string_length = 0;
    (pIVar8->content).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pIVar8->content).field_2 + 8) = 0;
    (pIVar8->foundHere).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(pIVar8->foundHere).field_2 + 8) = 0;
    pIVar8->thunk = (HeapThunk *)0x0;
    (pIVar8->foundHere)._M_dataplus._M_p = (pointer)&(pIVar8->foundHere).field_2;
    (pIVar8->foundHere)._M_string_length = 0;
    (pIVar8->content)._M_dataplus._M_p = (pointer)&(pIVar8->content).field_2;
    (pIVar8->content).field_2._M_local_buf[0] = '\0';
    strlen(local_e0);
    std::__cxx11::string::_M_replace((ulong)pIVar8,0,(char *)0x0,(ulong)pcVar4);
    std::__cxx11::string::_M_assign((string *)&pIVar8->content);
    pIVar8->thunk = (HeapThunk *)0x0;
    free(local_e0);
    ppIVar7 = std::
              map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
              ::operator[](&this->cachedImports,&local_70);
    *ppIVar7 = pIVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_70.second._M_dataplus._M_p != &local_70.second.field_2) {
    operator_delete(local_70.second._M_dataplus._M_p,
                    local_70.second.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.first._M_dataplus._M_p != &local_70.first.field_2) {
    operator_delete(local_70.first._M_dataplus._M_p,local_70.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return pIVar8;
}

Assistant:

ImportCacheValue *importData(const LocationRange &loc, const LiteralString *file)
    {
        // `dir` is passed to the importCallback, which may be externally defined.
        // For backwards compatibility, we need to keep the trailing directory separator.
        // For example, the default callback in libjsonnet.cpp joins paths with simple
        // string concatenation. Other (external) implementations might do the same.
        std::string dir = path_dir_with_trailing_separator(loc.file);

        const UString &path = file->value;

        std::pair<std::string, UString> key(dir, path);
        ImportCacheValue *cached_value = cachedImports[key];
        if (cached_value != nullptr)
            return cached_value;

        char *found_here_cptr;
        char *buf = NULL;
        size_t buflen = 0;
        int result = importCallback(importCallbackContext,
                                    dir.c_str(),
                                    encode_utf8(path).c_str(),
                                    &found_here_cptr,
                                    &buf,
                                    &buflen);

        std::string input(buf, buflen);
        ::free(buf);

        if (result == 1) {  // failure
            std::string epath = encode_utf8(jsonnet_string_escape(path, false));
            std::string msg = "couldn't open import \"" + epath + "\": ";
            msg += input;
            throw makeError(loc, msg);
        }

        auto *input_ptr = new ImportCacheValue();
        input_ptr->foundHere = found_here_cptr;
        input_ptr->content = input;
        input_ptr->thunk = nullptr;  // May be filled in later by import().
        ::free(found_here_cptr);
        cachedImports[key] = input_ptr;
        return input_ptr;
    }